

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Treap.h
# Opt level: O0

void __thiscall Treap<unsigned_long>::insert(Treap<unsigned_long> *this,unsigned_long val)

{
  Node *pNVar1;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> pVar2;
  Node *local_40;
  pair<Treap<unsigned_long>::Node_*,_Treap<unsigned_long>::Node_*> t;
  Node *newNode;
  unsigned_long val_local;
  Treap<unsigned_long> *this_local;
  
  pNVar1 = (Node *)operator_new(0x20);
  Node::Node(pNVar1,val);
  pVar2 = split(this,this->root,val);
  local_40 = pVar2.first;
  pNVar1 = merge(this,local_40,pNVar1);
  t.first = pVar2.second;
  pNVar1 = merge(this,pNVar1,t.first);
  this->root = pNVar1;
  return;
}

Assistant:

void insert(T val) {
    Node *newNode = new Node(val);
    auto t = split(root, val);
    t.first = merge(t.first, newNode);
    root = merge(t.first, t.second);
  }